

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdin_checkfile(char *urltype,char *infile,char *outfile)

{
  size_t sVar1;
  char *in_RDX;
  char *in_RDI;
  
  sVar1 = strlen(in_RDX);
  if (sVar1 == 0) {
    stdin_outfile[0] = '\0';
  }
  else {
    stdin_outfile[0] = '\0';
    strncat(stdin_outfile,in_RDX,0x400);
    strcpy(in_RDI,"stdinfile://");
  }
  return 0;
}

Assistant:

int stdin_checkfile(char *urltype, char *infile, char *outfile)
/*
   do any special case checking when opening a file on the stdin stream
*/
{
    if (strlen(outfile))
    {
        stdin_outfile[0] = '\0';
        strncat(stdin_outfile,outfile,FLEN_FILENAME-1); /* an output file is specified */
	strcpy(urltype,"stdinfile://");
    }
    else
        *stdin_outfile = '\0';  /* no output file was specified */

    return(0);
}